

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.cc
# Opt level: O2

bool __thiscall
tcmalloc::PageHeap::CheckSet(PageHeap *this,SpanSet *spanset,Length min_pages,int freelist)

{
  ulong *puVar1;
  _Base_ptr p_Var2;
  Leaf *pLVar3;
  LogItem b;
  LogItem b_00;
  LogItem b_01;
  LogItem b_02;
  LogItem b_03;
  LogItem c;
  LogItem c_00;
  LogItem c_01;
  LogItem c_02;
  LogItem c_03;
  LogItem d;
  LogItem d_00;
  LogItem d_01;
  LogItem d_02;
  LogItem d_03;
  _Rb_tree_node_base *p_Var4;
  ulong uVar5;
  ulong *puVar6;
  undefined4 uStack_11c;
  anon_union_8_4_e5b1a622_for_u_ aStack_118;
  undefined4 uStack_10c;
  anon_union_8_4_e5b1a622_for_u_ aStack_108;
  undefined4 uStack_fc;
  anon_union_8_4_e5b1a622_for_u_ aStack_f8;
  undefined4 uStack_ec;
  anon_union_8_4_e5b1a622_for_u_ aStack_e8;
  undefined4 uStack_dc;
  anon_union_8_4_e5b1a622_for_u_ aStack_d8;
  undefined4 uStack_cc;
  anon_union_8_4_e5b1a622_for_u_ aStack_c8;
  undefined4 uStack_bc;
  anon_union_8_4_e5b1a622_for_u_ aStack_b8;
  undefined4 uStack_ac;
  anon_union_8_4_e5b1a622_for_u_ aStack_a8;
  undefined4 uStack_9c;
  anon_union_8_4_e5b1a622_for_u_ aStack_98;
  undefined4 uStack_8c;
  anon_union_8_4_e5b1a622_for_u_ aStack_88;
  undefined4 uStack_7c;
  anon_union_8_4_e5b1a622_for_u_ aStack_78;
  undefined4 uStack_6c;
  anon_union_8_4_e5b1a622_for_u_ aStack_68;
  undefined4 uStack_5c;
  anon_union_8_4_e5b1a622_for_u_ aStack_58;
  undefined4 uStack_4c;
  anon_union_8_4_e5b1a622_for_u_ aStack_48;
  undefined4 uStack_3c;
  anon_union_8_4_e5b1a622_for_u_ aStack_38;
  
  p_Var4 = (spanset->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var4 == &(spanset->_M_t)._M_impl.super__Rb_tree_header) {
      return true;
    }
    puVar1 = *(ulong **)(p_Var4 + 1);
    p_Var2 = (_Base_ptr)puVar1[1];
    if (p_Var2 != p_Var4[1]._M_parent) {
      d._4_4_ = uStack_fc;
      d.tag_ = 4;
      c._4_4_ = uStack_10c;
      c.tag_ = 4;
      b._4_4_ = uStack_11c;
      b.tag_ = 4;
      b.u_.str = aStack_118.str;
      c.u_.str = aStack_108.str;
      d.u_.str = aStack_f8.str;
      Log(kCrash,
          "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/page_heap.cc"
          ,0x336,(LogItem)(ZEXT816(0x123b37) << 0x40),b,c,d);
      do {
      } while( true );
    }
    if ((*(byte *)((long)puVar1 + 0x2b) & 3) != freelist) {
      d_00._4_4_ = uStack_cc;
      d_00.tag_ = 4;
      c_00._4_4_ = uStack_dc;
      c_00.tag_ = 4;
      b_00._4_4_ = uStack_ec;
      b_00.tag_ = 4;
      b_00.u_.str = aStack_e8.str;
      c_00.u_.str = aStack_d8.str;
      d_00.u_.str = aStack_c8.str;
      Log(kCrash,
          "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/page_heap.cc"
          ,0x337,(LogItem)(ZEXT816(0x123aab) << 0x40),b_00,c_00,d_00);
      do {
      } while( true );
    }
    if (p_Var2 < min_pages) break;
    uVar5 = *puVar1;
    if ((uVar5 < 0x800000000) &&
       (pLVar3 = (this->pagemap_).root_[uVar5 >> 0x12], pLVar3 != (Leaf *)0x0)) {
      puVar6 = (ulong *)pLVar3->values[(uint)uVar5 & 0x3ffff];
    }
    else {
      puVar6 = (ulong *)0x0;
    }
    if (puVar6 != puVar1) {
      d_02._4_4_ = uStack_6c;
      d_02.tag_ = 4;
      c_02._4_4_ = uStack_7c;
      c_02.tag_ = 4;
      b_02._4_4_ = uStack_8c;
      b_02.tag_ = 4;
      b_02.u_.str = aStack_88.str;
      c_02.u_.str = aStack_78.str;
      d_02.u_.str = aStack_68.str;
      Log(kCrash,
          "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/page_heap.cc"
          ,0x339,(LogItem)(ZEXT816(0x123af1) << 0x40),b_02,c_02,d_02);
      do {
      } while( true );
    }
    uVar5 = (long)p_Var2 + (uVar5 - 1);
    if ((uVar5 < 0x800000000) &&
       (pLVar3 = (this->pagemap_).root_[uVar5 >> 0x12], pLVar3 != (Leaf *)0x0)) {
      puVar6 = (ulong *)pLVar3->values[(uint)uVar5 & 0x3ffff];
    }
    else {
      puVar6 = (ulong *)0x0;
    }
    if (puVar6 != puVar1) {
      d_03._4_4_ = uStack_3c;
      d_03.tag_ = 4;
      c_03._4_4_ = uStack_4c;
      c_03.tag_ = 4;
      b_03._4_4_ = uStack_5c;
      b_03.tag_ = 4;
      b_03.u_.str = aStack_58.str;
      c_03.u_.str = aStack_48.str;
      d_03.u_.str = aStack_38.str;
      Log(kCrash,
          "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/page_heap.cc"
          ,0x33a,(LogItem)(ZEXT816(0x123b0e) << 0x40),b_03,c_03,d_03);
      do {
      } while( true );
    }
    p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
  }
  d_01._4_4_ = uStack_9c;
  d_01.tag_ = 4;
  c_01._4_4_ = uStack_ac;
  c_01.tag_ = 4;
  b_01._4_4_ = uStack_bc;
  b_01.tag_ = 4;
  b_01.u_.str = aStack_b8.str;
  c_01.u_.str = aStack_a8.str;
  d_01.u_.str = aStack_98.str;
  Log(kCrash,
      "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/page_heap.cc",
      0x338,(LogItem)(ZEXT816(0x123ac3) << 0x40),b_01,c_01,d_01);
  do {
  } while( true );
}

Assistant:

bool PageHeap::CheckSet(SpanSet* spanset, Length min_pages,int freelist) {
  for (SpanSetIter it = spanset->begin(); it != spanset->end(); ++it) {
    Span* s = it->span;
    CHECK_CONDITION(s->length == it->length);
    CHECK_CONDITION(s->location == freelist);  // NORMAL or RETURNED
    CHECK_CONDITION(s->length >= min_pages);
    CHECK_CONDITION(GetDescriptor(s->start) == s);
    CHECK_CONDITION(GetDescriptor(s->start+s->length-1) == s);
  }
  return true;
}